

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.h
# Opt level: O2

string * __thiscall
cmJSONState::Error::GetErrorMessage_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->message);
  if (0 < (this->location).line) {
    cmStrCat<char_const(&)[9],int_const&,char_const(&)[2],int_const&,char_const(&)[3],std::__cxx11::string&>
              (&local_30,(char (*) [9])"Error: @",(int *)this,(char (*) [2])0x765590,
               &(this->location).column,(char (*) [3])0x7c10c0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetErrorMessage() const
    {
      std::string output = message;
      if (location.line > 0) {
        output = cmStrCat("Error: @", location.line, ",", location.column,
                          ": ", output);
      }
      return output;
    }